

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::GenerateTruncWithCheck<false>(Lowerer *this,Instr *instr)

{
  IRType type;
  JnHelperMethod helperMethod;
  Opnd *opndArg;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LowererMD *this_00;
  
  if (1 < (byte)(instr->m_src1->m_type - TyFloat32)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5209,"(instr->GetSrc1()->IsFloat())","instr->GetSrc1()->IsFloat()");
    if (!bVar2) goto LAB_005ec5ea;
    *puVar3 = 0;
  }
  type = instr->m_dst->m_type;
  if ((type | TyInt64) == TyUint32) {
    LowererMD::GenerateTruncWithCheck<false>(&this->m_lowererMD,instr);
    return;
  }
  bVar2 = IRType_IsInt64(type);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5210,"(instr->GetDst()->IsInt64())","instr->GetDst()->IsInt64()");
    if (!bVar2) {
LAB_005ec5ea:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  LoadScriptContext(this,instr);
  opndArg = instr->m_src1;
  this_00 = &this->m_lowererMD;
  if (opndArg->m_type == TyFloat32) {
    LowererMD::LoadFloatHelperArgument(this_00,instr,opndArg);
  }
  else {
    LowererMD::LoadDoubleHelperArgument(this_00,instr,opndArg);
  }
  helperMethod = *(JnHelperMethod *)
                  (&DAT_0103a310 +
                  (ulong)(instr->m_dst->m_type == TyUint64) * 4 +
                  (ulong)(instr->m_src1->m_type != TyFloat32) * 8);
  IR::Instr::UnlinkSrc1(instr);
  LowererMD::ChangeToHelperCall
            (this_00,instr,helperMethod,(LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  return;
}

Assistant:

void Lowerer::GenerateTruncWithCheck(_In_ IR::Instr* instr)
{

    Assert(instr->GetSrc1()->IsFloat());
    if (instr->GetDst()->IsInt32() || instr->GetDst()->IsUInt32())
    {
        m_lowererMD.GenerateTruncWithCheck<Saturate>(instr);
    }
    else
    {
        Assert(instr->GetDst()->IsInt64());
        LoadScriptContext(instr);

        if (instr->GetSrc1()->IsFloat32())
        {
            m_lowererMD.LoadFloatHelperArgument(instr, instr->GetSrc1());
        }
        else
        {
            m_lowererMD.LoadDoubleHelperArgument(instr, instr->GetSrc1());
        }
        IR::JnHelperMethod helper;
        if (Saturate)
        {
            IR::JnHelperMethod helperList[2][2] = { IR::HelperF32ToI64Sat, IR::HelperF32ToU64Sat, IR::HelperF64ToI64Sat ,IR::HelperF64ToU64Sat };
            helper = helperList[instr->GetSrc1()->GetType() != TyFloat32][instr->GetDst()->GetType() == TyUint64];
        }
        else
        {
            IR::JnHelperMethod helperList[2][2] = { IR::HelperF32ToI64, IR::HelperF32ToU64, IR::HelperF64ToI64 ,IR::HelperF64ToU64 };
            helper = helperList[instr->GetSrc1()->GetType() != TyFloat32][instr->GetDst()->GetType() == TyUint64];
        }
        instr->UnlinkSrc1();
        this->m_lowererMD.ChangeToHelperCall(instr, helper);
    }
}